

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-connection-fail.c
# Opt level: O1

void on_connect_without_close(uv_connect_t *req,int status)

{
  int64_t eval_b;
  int64_t eval_a;
  
  if (status == -0x6f) {
    connect_cb_calls = connect_cb_calls + 1;
    uv_timer_start(&timer,timer_cb,100,0);
    if (close_cb_calls == 0) {
      return;
    }
  }
  else {
    on_connect_without_close_cold_1();
  }
  on_connect_without_close_cold_2();
  close_cb_calls = close_cb_calls + 1;
  return;
}

Assistant:

static void on_connect_without_close(uv_connect_t *req, int status) {
  ASSERT_EQ(status, UV_ECONNREFUSED);
  connect_cb_calls++;

  uv_timer_start(&timer, timer_cb, 100, 0);

  ASSERT_OK(close_cb_calls);
}